

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimc.c
# Opt level: O3

void optsummary(opt_object obj)

{
  long lVar1;
  
  printf("\n Return Value : %d \n",(ulong)(uint)obj->retval);
  printf("Method : %d %s \n",(ulong)(uint)obj->Method,obj->MethodName);
  printf("Iterations : %d \n",(ulong)(uint)obj->Iter);
  printf("Function Minimized At : [ ");
  if (0 < obj->N) {
    lVar1 = 0;
    do {
      printf("%g ",obj->xopt[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < obj->N);
  }
  puts(" ] ");
  printf("Function Value : %g \n \n",obj->objfunc);
  return;
}

Assistant:

void optsummary(opt_object obj) {
	int i;
	printf("\n Return Value : %d \n",obj->retval);
	printf("Method : %d %s \n",obj->Method,obj->MethodName);
	printf("Iterations : %d \n",obj->Iter);
	printf("Function Minimized At : [ ");
	for(i = 0; i < obj->N;++i) {
		printf("%g ",obj->xopt[i]);
	}
	printf(" ] \n");
	printf("Function Value : %g \n \n",obj->objfunc);

}